

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.cpp
# Opt level: O0

string * trim(string *str,string *chars)

{
  string *psVar1;
  string *in_RSI;
  string *in_stack_ffffffffffffffe8;
  
  rtrim(in_RSI,in_stack_ffffffffffffffe8);
  psVar1 = ltrim(in_RSI,in_stack_ffffffffffffffe8);
  return psVar1;
}

Assistant:

std::string& trim(std::string& str, const std::string& chars) {
  return ltrim(rtrim(str, chars), chars);
}